

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionAddStr.cpp
# Opt level: O1

void __thiscall Hpipe::InstructionAddStr::get_code_repr(InstructionAddStr *this,ostream *os)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"ADD_STR ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->var)._M_dataplus._M_p,(this->var)._M_string_length);
  return;
}

Assistant:

void InstructionAddStr::get_code_repr( std::ostream &os ) {
    os << "ADD_STR " << var.size() << " " << var;
}